

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.cpp
# Opt level: O0

void __thiscall Clasp::SmallClauseAlloc::~SmallClauseAlloc(SmallClauseAlloc *this)

{
  undefined8 *puVar1;
  undefined8 *in_RDI;
  Block *t;
  Block *r;
  undefined8 local_10;
  
  local_10 = (undefined8 *)*in_RDI;
  while (local_10 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*local_10;
    operator_delete(local_10);
    local_10 = puVar1;
  }
  return;
}

Assistant:

SmallClauseAlloc::~SmallClauseAlloc() {
	Block* r = blocks_;
	while (r) {
		Block* t = r;
		r = r->next;
		::operator delete(t);
	}
}